

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_l2_norm(quadratic_cost_type<double> *this,int n)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  type pdVar4;
  type piVar5;
  type pqVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int local_34;
  int e_1;
  int i_3;
  int i_2;
  int e;
  int i_1;
  int i;
  double div;
  int n_local;
  quadratic_cost_type<double> *this_local;
  
  _i_1 = 0.0;
  for (e = 0; e != n; e = e + 1) {
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)e);
    dVar1 = *pdVar4;
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)e);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *pdVar4;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = _i_1;
    auVar7 = vfmadd213sd_fma(auVar7,auVar9,auVar11);
    _i_1 = auVar7._0_8_;
  }
  i_2 = 0;
  piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar2 = *piVar5;
  for (; i_2 != iVar2; i_2 = i_2 + 1) {
    pqVar6 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_2);
    dVar1 = pqVar6->factor;
    pqVar6 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_2);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pqVar6->factor;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = _i_1;
    auVar7 = vfmadd213sd_fma(auVar8,auVar10,auVar12);
    _i_1 = auVar7._0_8_;
  }
  bVar3 = std::isnormal(_i_1);
  if (bVar3) {
    for (e_1 = 0; e_1 != n; e_1 = e_1 + 1) {
      pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *pdVar4 = *pdVar4 / _i_1;
    }
    local_34 = 0;
    piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n)
    ;
    iVar2 = *piVar5;
    for (; local_34 != iVar2; local_34 = local_34 + 1) {
      pqVar6 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_34);
      pqVar6->factor = pqVar6->factor / _i_1;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }